

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::init
          (SamplePosRasterizationTest *this,EVP_PKEY_CTX *ctx)

{
  int *value;
  vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
  *this_00;
  ostringstream *poVar1;
  TestLog *pTVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  pointer pTVar5;
  pointer pVVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  undefined4 uVar10;
  GLint GVar11;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar13;
  MessageBuilder *this_01;
  undefined4 extraout_var_00;
  ProgramSources *pPVar14;
  ulong uVar15;
  undefined4 extraout_var_01;
  ShaderProgram *this_02;
  TestError *pTVar16;
  NotSupportedError *pNVar17;
  char *code;
  ShaderProgram *description;
  ulong uVar18;
  int i;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  GLint maxSamples;
  StateQueryMemoryWriteGuard<float[2]> position;
  GLuint fboID;
  string local_338 [32];
  float local_318;
  GLuint *local_300;
  string local_2f8;
  undefined8 local_2d8;
  int *local_2c0;
  GLuint *local_2b8;
  GLuint *local_2b0;
  ScopedLogSection section;
  Triangle tri;
  ShaderProgram program;
  long lVar12;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar8);
  maxSamples = 0;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  value = &this->m_canvasSize;
  if (this->m_canvasSize <= pRVar13->m_width) {
    pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (this->m_canvasSize <= pRVar13->m_height) {
      (**(code **)(lVar12 + 0x868))(0x910e,&maxSamples);
      if (maxSamples < this->m_samples) {
        pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tri,
                   "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES",
                   (allocator<char> *)&program);
        tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)&tri);
        __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(tri.p1.m_data + 2);
      tri.p1.m_data[0] = SUB84(pTVar2,0);
      tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"GL_MAX_COLOR_TEXTURE_SAMPLES = ");
      std::ostream::operator<<(poVar1,maxSamples);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (**(code **)(lVar12 + 0x868))(0xd50,&this->m_subpixelBits);
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(tri.p1.m_data + 2);
      tri.p1.m_data[0] = SUB84(pTVar2,0);
      tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"GL_SUBPIXEL_BITS = ");
      this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)&tri,&this->m_subpixelBits);
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_2c0 = value;
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(tri.p1.m_data + 2);
      tri.p1.m_data[0] = SUB84(pTVar2,0);
      tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Creating multisample texture");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_300 = &this->m_texID;
      (**(code **)(lVar12 + 0x6f8))(1);
      (**(code **)(lVar12 + 0xb8))(0x9100,this->m_texID);
      (**(code **)(lVar12 + 0x1390))
                (0x9100,this->m_samples,0x8058,this->m_canvasSize,this->m_canvasSize,1);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"texStorage2DMultisample",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe3);
      local_2b0 = &this->m_vaoID;
      (**(code **)(lVar12 + 0x708))(1);
      (**(code **)(lVar12 + 0xd8))(this->m_vaoID);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"bindVertexArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe7);
      local_2b8 = &this->m_vboID;
      (**(code **)(lVar12 + 0x6c8))(1);
      (**(code **)(lVar12 + 0x40))(0x8892,this->m_vboID);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      code = (char *)0xeb;
      glu::checkError(dVar9,"bindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xeb);
      this_00 = &this->m_testTriangles;
      for (iVar8 = 1; iVar8 != 0x15; iVar8 = iVar8 + 1) {
        Triangle::Triangle(&tri);
        tri.p1.m_data[0] = (1.0 / (float)iVar8 + (float)(iVar8 + -1)) / 20.0;
        tri.p1.m_data[1] = 0.0;
        tri.p1.m_data[2] = 0.0;
        tri.p1.m_data[3] = 1.0;
        tri.p2.m_data[0] = ((float)(iVar8 + -1) + 0.3 + 1.0 / (float)iVar8) / 20.0;
        tri.p2.m_data[1] = 0.0;
        tri.p2.m_data[2] = 0.0;
        tri.p2.m_data[3] = 1.0;
        tri.p3.m_data[1] = -1.0;
        tri.p3.m_data[2] = 0.0;
        tri.p3.m_data[3] = 1.0;
        tri.p3.m_data[0] = tri.p1.m_data[0];
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,&tri);
      }
      for (iVar8 = 1; iVar8 != 0x15; iVar8 = iVar8 + 1) {
        Triangle::Triangle(&tri);
        tri.p1.m_data[1] = (1.0 / (float)iVar8 + (float)(iVar8 + -1)) / 20.0;
        tri.p1.m_data[0] = -1.0;
        tri.p1.m_data[2] = 0.0;
        tri.p1.m_data[3] = 1.0;
        tri.p2.m_data[1] = ((float)(iVar8 + -1) + 0.3 + 1.0 / (float)iVar8) / 20.0;
        tri.p2.m_data[0] = -1.0;
        tri.p2.m_data[2] = 0.0;
        tri.p2.m_data[3] = 1.0;
        tri.p3.m_data[0] = 0.0;
        tri.p3.m_data[2] = 0.0;
        tri.p3.m_data[3] = 1.0;
        tri.p3.m_data[1] = tri.p1.m_data[1];
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,&tri);
      }
      for (iVar8 = 0; iVar8 != 0x14; iVar8 = iVar8 + 1) {
        local_318 = ((float)iVar8 / 20.0) * 3.1415927;
        local_318 = local_318 + local_318;
        fVar19 = cosf(local_318);
        local_2d8 = (vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                    CONCAT44(extraout_XMM0_Db,fVar19);
        local_318 = sinf(local_318);
        Triangle::Triangle(&tri);
        tri.p1.m_data[0] = 0.4;
        tri.p1.m_data[1] = 0.4;
        tri.p1.m_data[2] = 0.0;
        tri.p1.m_data[3] = 1.0;
        tri.p2.m_data[0] = (float)local_2d8 * 0.5 + 0.5;
        tri.p2.m_data[1] = local_318 * 0.5 + 0.5;
        tri.p2.m_data[2] = 0.0;
        tri.p2.m_data[3] = 1.0;
        tri.p3.m_data[0] = tri.p2.m_data[0] + 0.1;
        tri.p3.m_data[1] = tri.p2.m_data[1] + 0.02;
        tri.p3.m_data[2] = 0.0;
        tri.p3.m_data[3] = 1.0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,&tri);
      }
      Triangle::Triangle(&tri);
      tri.p1.m_data[0] = -0.202;
      tri.p1.m_data[1] = -0.202;
      tri.p1.m_data[2] = 0.0;
      tri.p1.m_data[3] = 1.0;
      tri.p2.m_data[0] = -0.802;
      tri.p2.m_data[1] = -0.202;
      tri.p2.m_data[2] = 0.0;
      tri.p2.m_data[3] = 1.0;
      tri.p3.m_data[0] = -0.802;
      tri.p3.m_data[1] = -0.802;
      tri.p3.m_data[2] = 0.0;
      tri.p3.m_data[3] = 1.0;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
      ::push_back(this_00,&tri);
      iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar12 = CONCAT44(extraout_var_00,iVar8);
      pCVar3 = (this->super_TestCase).m_context;
      pRVar4 = pCVar3->m_renderCtx;
      memset(&tri,0,0xac);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2f8,(_anonymous_namespace_ *)pCVar3,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,code);
      glu::VertexSource::VertexSource((VertexSource *)&position,&local_2f8);
      pPVar14 = glu::ProgramSources::operator<<((ProgramSources *)&tri,(ShaderSource *)&position);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                ((string *)&section,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
                 ,code);
      glu::FragmentSource::FragmentSource((FragmentSource *)&fboID,(string *)&section);
      pPVar14 = glu::ProgramSources::operator<<(pPVar14,(ShaderSource *)&fboID);
      glu::ShaderProgram::ShaderProgram(&program,pRVar4,pPVar14);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)position.m_value);
      std::__cxx11::string::~string((string *)&local_2f8);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&tri);
      uVar10 = (**(code **)(lVar12 + 0x780))(program.m_program.m_program,"a_position");
      fboID = 0;
      if (program.m_program.m_info.linkOk != false) {
        (**(code **)(lVar12 + 0xb8))(0x9100,*local_300);
        (**(code **)(lVar12 + 0xd8))(*local_2b0);
        (**(code **)(lVar12 + 0x40))(0x8892,*local_2b8);
        pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(tri.p1.m_data + 2);
        tri.p1.m_data[0] = SUB84(pTVar2,0);
        tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Attaching texture to FBO");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        (**(code **)(lVar12 + 0x6d0))(1,&fboID);
        (**(code **)(lVar12 + 0x78))(0x8d40,fboID);
        (**(code **)(lVar12 + 0x6a0))(0x8d40,0x8ce0,0x9100,*local_300,0);
        dVar9 = (**(code **)(lVar12 + 0x800))();
        glu::checkError(dVar9,"framebufferTexture2D",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                        ,0x17a);
        pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(tri.p1.m_data + 2);
        tri.p1.m_data[0] = SUB84(pTVar2,0);
        tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        local_318 = (float)uVar10;
        std::operator<<((ostream *)poVar1,"Sample locations:");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        poVar1 = (ostringstream *)(tri.p1.m_data + 2);
        local_2d8 = (vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                    &this->m_samplePositions;
        iVar8 = 0;
        while( true ) {
          if (this->m_samples <= iVar8) {
            pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(tri.p1.m_data + 2);
            tri.p1.m_data[0] = SUB84(pTVar2,0);
            tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"Drawing test pattern to the texture");
            fVar19 = local_318;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            pTVar5 = (this->m_testTriangles).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            (**(code **)(lVar12 + 0x150))
                      (0x8892,(long)(this->m_testTriangles).
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5,pTVar5
                       ,0x88e4);
            dVar9 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar9,"bufferData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                            ,0x192);
            (**(code **)(lVar12 + 0x1a00))(0,0,*local_2c0);
            (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
            (**(code **)(lVar12 + 0x188))(0x4000);
            (**(code **)(lVar12 + 0x19f0))(fVar19,4,0x1406,0,0,0);
            (**(code **)(lVar12 + 0x610))(fVar19);
            dVar9 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar9,"vertexAttribPointer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                            ,0x199);
            (**(code **)(lVar12 + 0x1680))(program.m_program.m_program);
            (**(code **)(lVar12 + 0x538))
                      (4,0,(int)(((long)(this->m_testTriangles).
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_testTriangles).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x30) * 3);
            dVar9 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar9,"drawArrays",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                            ,0x19d);
            (**(code **)(lVar12 + 0x518))(fVar19);
            (**(code **)(lVar12 + 0x1680))(0);
            (**(code **)(lVar12 + 0x440))(1,&fboID);
            dVar9 = (**(code **)(lVar12 + 0x800))();
            glu::checkError(dVar9,"cleanup",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                            ,0x1a2);
            glu::ShaderProgram::~ShaderProgram(&program);
            uVar18 = 0;
            uVar15 = (ulong)(uint)this->m_samples;
            if (this->m_samples < 1) {
              uVar15 = uVar18;
            }
            pVVar6 = (this->m_samplePositions).
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar8 = 0;
            while( true ) {
              if (uVar15 * 8 == uVar18) {
                pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&tri,"Generate sampler shader",(allocator<char> *)&position);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&program,"Generate sampler shader",(allocator<char> *)&fboID);
                description = &program;
                tcu::ScopedLogSection::ScopedLogSection
                          (&section,pTVar2,(string *)&tri,(string *)description);
                std::__cxx11::string::~string((string *)&program);
                std::__cxx11::string::~string((string *)&tri);
                iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])()
                ;
                lVar12 = CONCAT44(extraout_var_01,iVar8);
                this_02 = (ShaderProgram *)operator_new(0xd0);
                pCVar3 = (this->super_TestCase).m_context;
                pRVar4 = pCVar3->m_renderCtx;
                memset(&tri,0,0xac);
                Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                          ((string *)&fboID,(_anonymous_namespace_ *)pCVar3,
                           (Context *)
                           "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                           ,(char *)description);
                glu::VertexSource::VertexSource((VertexSource *)&program,(string *)&fboID);
                pPVar14 = glu::ProgramSources::operator<<
                                    ((ProgramSources *)&tri,(ShaderSource *)&program);
                Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                          (&local_2f8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                           (Context *)
                           "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp sampler2DMS u_sampler;\nuniform highp int u_sample;\nvoid main (void)\n{\n\tfragColor = texelFetch(u_sampler, ivec2(int(floor(gl_FragCoord.x)), int(floor(gl_FragCoord.y))), u_sample);\n}\n"
                           ,(char *)description);
                glu::FragmentSource::FragmentSource((FragmentSource *)&position,&local_2f8);
                pPVar14 = glu::ProgramSources::operator<<(pPVar14,(ShaderSource *)&position);
                glu::ShaderProgram::ShaderProgram(this_02,pRVar4,pPVar14);
                this->m_samplerProgram = this_02;
                std::__cxx11::string::~string((string *)position.m_value);
                std::__cxx11::string::~string((string *)&local_2f8);
                std::__cxx11::string::~string
                          ((string *)
                           &program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
                std::__cxx11::string::~string((string *)&fboID);
                glu::ProgramSources::~ProgramSources((ProgramSources *)&tri);
                glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                                m_log,this->m_samplerProgram);
                if ((this->m_samplerProgram->m_program).m_info.linkOk != false) {
                  GVar11 = (**(code **)(lVar12 + 0x780))
                                     ((this->m_samplerProgram->m_program).m_program,"a_position");
                  this->m_samplerProgramPosLoc = GVar11;
                  GVar11 = (**(code **)(lVar12 + 0xb48))
                                     ((this->m_samplerProgram->m_program).m_program,"u_sampler");
                  this->m_samplerProgramSamplerLoc = GVar11;
                  GVar11 = (**(code **)(lVar12 + 0xb48))
                                     ((this->m_samplerProgram->m_program).m_program,"u_sample");
                  this->m_samplerProgramSampleNdxLoc = GVar11;
                  tcu::ScopedLogSection::~ScopedLogSection(&section);
                  return extraout_EAX;
                }
                pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&tri,"Could not create sampler program.",
                           (allocator<char> *)&program);
                tcu::TestError::TestError(pTVar16,(string *)&tri);
                __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              fVar19 = *(float *)((long)pVVar6->m_data + uVar18);
              if ((((fVar19 < 0.0) || (1.0 < fVar19)) ||
                  (fVar19 = *(float *)((long)pVVar6->m_data + uVar18 + 4), fVar19 < 0.0)) ||
                 (1.0 < fVar19)) break;
              iVar8 = iVar8 + 1;
              uVar18 = uVar18 + 8;
            }
            pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(tri.p1.m_data + 2);
            tri.p1.m_data[0] = SUB84(pTVar2,0);
            tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"// ERROR: Sample position of sample ");
            std::ostream::operator<<(poVar1,iVar8);
            std::operator<<((ostream *)poVar1," should be in range ([0, 1], [0, 1]). Got ");
            tcu::operator<<((ostream *)poVar1,(Vector<float,_2> *)(uVar18 + *(long *)local_2d8));
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tri,"invalid sample position",(allocator<char> *)&program);
            tcu::TestError::TestError(pTVar16,(string *)&tri);
            __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::
          StateQueryMemoryWriteGuard(&position);
          (**(code **)(lVar12 + 0x8e8))(0x8e50,iVar8,position.m_value);
          bVar7 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                            (&position,
                             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          if (!bVar7) break;
          pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          tri.p1.m_data[0] = SUB84(pTVar2,0);
          tri.p1.m_data[1] = (float)((ulong)pTVar2 >> 0x20);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"\t");
          std::ostream::operator<<(poVar1,iVar8);
          std::operator<<((ostream *)poVar1,": (");
          std::ostream::operator<<(poVar1,position.m_value[0]);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,position.m_value[1]);
          std::operator<<((ostream *)poVar1,")");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&tri,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          tri.p1.m_data[0] = position.m_value[0];
          tri.p1.m_data[1] = position.m_value[1];
          std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
          emplace_back<tcu::Vector<float,2>>(local_2d8,(Vector<float,_2> *)&tri);
          iVar8 = iVar8 + 1;
        }
        pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tri,"Error while querying sample positions",
                   (allocator<char> *)&local_2f8);
        tcu::TestError::TestError(pTVar16,(string *)&tri);
        __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      &program);
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tri,"Failed to build shader.",(allocator<char> *)&position);
      tcu::TestError::TestError(pTVar16,(string *)&tri);
      __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>((string *)&fboID,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&position,
                 "render target size must be at least ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fboID);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&position,"x")
  ;
  de::toString<int>(&local_2f8,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tri,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 &local_2f8);
  tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)&tri);
  __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SamplePosRasterizationTest::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	GLint					maxSamples	= 0;

	// requirements

	if (m_context.getRenderTarget().getWidth() < m_canvasSize || m_context.getRenderTarget().getHeight() < m_canvasSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(m_canvasSize) + "x" + de::toString(m_canvasSize));

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &maxSamples);
	if (m_samples > maxSamples)
		throw tcu::NotSupportedError("Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_COLOR_TEXTURE_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;

	gl.getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);
	m_testCtx.getLog() << tcu::TestLog::Message << "GL_SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;

	// generate textures & other gl stuff

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample texture" << tcu::TestLog::EndMessage;

	gl.genTextures				(1, &m_texID);
	gl.bindTexture				(GL_TEXTURE_2D_MULTISAMPLE, m_texID);
	gl.texStorage2DMultisample	(GL_TEXTURE_2D_MULTISAMPLE, m_samples, GL_RGBA8, m_canvasSize, m_canvasSize, GL_TRUE);
	GLU_EXPECT_NO_ERROR			(gl.getError(), "texStorage2DMultisample");

	gl.genVertexArrays		(1, &m_vaoID);
	gl.bindVertexArray		(m_vaoID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindVertexArray");

	gl.genBuffers			(1, &m_vboID);
	gl.bindBuffer			(GL_ARRAY_BUFFER, m_vboID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindBuffer");

	// generate test scene
	for (int i = 0; i < 20; ++i)
	{
		// vertical spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	-1.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	for (int i = 0; i < 20; ++i)
	{
		// horisontal spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(-1.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(-1.0f,	((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4( 0.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}

	for (int i = 0; i < 20; ++i)
	{
		// fan
		const tcu::Vec2 p = tcu::Vec2(deFloatCos(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f, deFloatSin(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f);
		const tcu::Vec2 d = tcu::Vec2(0.1f, 0.02f);

		Triangle tri;
		tri.p1 = tcu::Vec4(0.4f,			0.4f,			0.0f,	1.0f);
		tri.p2 = tcu::Vec4(p.x(),			p.y(),			0.0f,	1.0f);
		tri.p3 = tcu::Vec4(p.x() + d.x(),	p.y() + d.y(),	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	{
		Triangle tri;
		tri.p1 = tcu::Vec4(-0.202f, -0.202f, 0.0f, 1.0f);
		tri.p2 = tcu::Vec4(-0.802f, -0.202f, 0.0f, 1.0f);
		tri.p3 = tcu::Vec4(-0.802f, -0.802f, 0.0f, 1.0f);
		m_testTriangles.push_back(tri);
	}

	// generate multisample texture (and query the sample positions in it)
	genMultisampleTexture();

	// verify queried samples are in a valid range
	for (int sampleNdx = 0; sampleNdx < m_samples; ++sampleNdx)
	{
		if (m_samplePositions[sampleNdx].x() < 0.0f || m_samplePositions[sampleNdx].x() > 1.0f ||
			m_samplePositions[sampleNdx].y() < 0.0f || m_samplePositions[sampleNdx].y() > 1.0f)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: Sample position of sample " << sampleNdx << " should be in range ([0, 1], [0, 1]). Got " << m_samplePositions[sampleNdx] << tcu::TestLog::EndMessage;
			throw tcu::TestError("invalid sample position");
		}
	}

	// generate sampler program
	genSamplerProgram();
}